

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlExpandEntitiesInAttValue(xmlParserCtxtPtr ctxt,xmlChar *str,int normalize)

{
  xmlChar *pxVar1;
  int inSpace;
  xmlSBuf buf;
  int local_3c;
  xmlSBuf local_38;
  
  local_38.max = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    local_38.max = 10000000;
  }
  local_3c = 1;
  local_38.mem = (xmlChar *)0x0;
  local_38.size = 0;
  local_38.cap = 0;
  local_38.code = XML_ERR_OK;
  xmlExpandEntityInAttValue
            (ctxt,&local_38,str,(xmlEntityPtr)0x0,normalize,&local_3c,ctxt->inputNr,0);
  if (local_38.size != 0 && (local_3c != 0 && normalize != 0)) {
    local_38.size = local_38.size - 1;
  }
  pxVar1 = xmlSBufFinish(&local_38,(int *)0x0,ctxt,"AttValue length too long");
  return pxVar1;
}

Assistant:

xmlChar *
xmlExpandEntitiesInAttValue(xmlParserCtxtPtr ctxt, const xmlChar *str,
                            int normalize) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    int inSpace = 1;

    xmlSBufInit(&buf, maxLength);

    xmlExpandEntityInAttValue(ctxt, &buf, str, NULL, normalize, &inSpace,
                              ctxt->inputNr, /* check */ 0);

    if ((normalize) && (inSpace) && (buf.size > 0))
        buf.size--;

    return(xmlSBufFinish(&buf, NULL, ctxt, "AttValue length too long"));
}